

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
utf8::
utf16to8<unsigned_short_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (unsigned_short *start,unsigned_short *end,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result)

{
  bool bVar1;
  uint16_t uVar2;
  invalid_utf16 *piVar3;
  unsigned_short *puVar4;
  uint32_t local_2c;
  uint32_t trail_surrogate;
  uint32_t cp;
  unsigned_short *end_local;
  unsigned_short *start_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result_local;
  
  end_local = start;
  start_local = (unsigned_short *)result.container;
  do {
    if (end_local == end) {
      return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)start_local;
    }
    puVar4 = end_local + 1;
    uVar2 = internal::mask16<unsigned_short>(*end_local);
    local_2c = (uint32_t)uVar2;
    bVar1 = internal::is_lead_surrogate<unsigned_int>(local_2c);
    if (bVar1) {
      if (puVar4 == end) {
        piVar3 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar3,uVar2);
        __cxa_throw(piVar3,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
      uVar2 = internal::mask16<unsigned_short>(*puVar4);
      bVar1 = internal::is_trail_surrogate<unsigned_int>((uint)uVar2);
      if (!bVar1) {
        piVar3 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar3,uVar2);
        __cxa_throw(piVar3,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
      local_2c = local_2c * 0x400 + (uint)uVar2 + 0xfca02400;
      end_local = end_local + 2;
    }
    else {
      bVar1 = internal::is_trail_surrogate<unsigned_int>(local_2c);
      end_local = puVar4;
      if (bVar1) {
        piVar3 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar3,uVar2);
        __cxa_throw(piVar3,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
    }
    start_local = (unsigned_short *)
                  append<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (local_2c,(back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )start_local);
  } while( true );
}

Assistant:

octet_iterator utf16to8 (u16bit_iterator start, u16bit_iterator end, octet_iterator result)
    {
        while (start != end) {
            uint32_t cp = utf8::internal::mask16(*start++);
            // Take care of surrogate pairs first
            if (utf8::internal::is_lead_surrogate(cp)) {
                if (start != end) {
                    uint32_t trail_surrogate = utf8::internal::mask16(*start++);
                    if (utf8::internal::is_trail_surrogate(trail_surrogate))
                        cp = (cp << 10) + trail_surrogate + internal::SURROGATE_OFFSET;
                    else
                        throw invalid_utf16(static_cast<uint16_t>(trail_surrogate));
                }
                else
                    throw invalid_utf16(static_cast<uint16_t>(cp));

            }
            // Lone trail surrogate
            else if (utf8::internal::is_trail_surrogate(cp))
                throw invalid_utf16(static_cast<uint16_t>(cp));

            result = utf8::append(cp, result);
        }
        return result;
    }